

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O3

DispatchBuilder * __thiscall
kern::DispatchBuilder::chain
          (DispatchBuilder *this,
          unique_ptr<kern::Dispatch,_std::default_delete<kern::Dispatch>_> *dispatch)

{
  undefined8 *puVar1;
  invalid_argument *this_00;
  Dispatch *pDVar2;
  Dispatch *pDVar3;
  
  pDVar2 = this->inner;
  if (pDVar2 == (Dispatch *)0x0) {
    puVar1 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar1 = &PTR__exception_00108b70;
    __cxa_throw(puVar1,&BuilderReuseException::typeinfo,std::exception::~exception);
  }
  pDVar3 = (dispatch->_M_t).
           super___uniq_ptr_impl<kern::Dispatch,_std::default_delete<kern::Dispatch>_>._M_t.
           super__Tuple_impl<0UL,_kern::Dispatch_*,_std::default_delete<kern::Dispatch>_>.
           super__Head_base<0UL,_kern::Dispatch_*,_false>._M_head_impl;
  if (pDVar3 != (Dispatch *)0x0) {
    if ((pDVar2->is_def_format == false) && (pDVar3->is_def_format == true)) {
      std::function<void_(const_kern::Metadata_&,_const_char_*,_char_*)>::operator=
                (&pDVar3->format_func,&pDVar2->format_func);
      pDVar2 = this->inner;
      pDVar3 = (dispatch->_M_t).
               super___uniq_ptr_impl<kern::Dispatch,_std::default_delete<kern::Dispatch>_>._M_t.
               super__Tuple_impl<0UL,_kern::Dispatch_*,_std::default_delete<kern::Dispatch>_>.
               super__Head_base<0UL,_kern::Dispatch_*,_false>._M_head_impl;
    }
    if ((pDVar2->is_def_level == false) && (pDVar3->is_def_level == true)) {
      pDVar3->log_level = pDVar2->log_level;
    }
    if ((pDVar3->output_sink).super___shared_ptr<kern::Sink,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      (pDVar3->output_sink).super___shared_ptr<kern::Sink,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (pDVar2->output_sink).super___shared_ptr<kern::Sink,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(pDVar3->output_sink).super___shared_ptr<kern::Sink,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 &(pDVar2->output_sink).super___shared_ptr<kern::Sink,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      pDVar2 = this->inner;
    }
    std::
    vector<std::unique_ptr<kern::Dispatch,std::default_delete<kern::Dispatch>>,std::allocator<std::unique_ptr<kern::Dispatch,std::default_delete<kern::Dispatch>>>>
    ::emplace_back<std::unique_ptr<kern::Dispatch,std::default_delete<kern::Dispatch>>>
              ((vector<std::unique_ptr<kern::Dispatch,std::default_delete<kern::Dispatch>>,std::allocator<std::unique_ptr<kern::Dispatch,std::default_delete<kern::Dispatch>>>>
                *)&pDVar2->chain,dispatch);
    return this;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this_00,"dispatch argument is NULL");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

DispatchBuilder &DispatchBuilder::chain(std::unique_ptr<Dispatch> dispatch) {
        if(this->inner == nullptr)
            throw BuilderReuseException();

        if(dispatch == nullptr)
            throw std::invalid_argument("dispatch argument is NULL");

        // inherit format function
        if(!this->inner->is_def_format && dispatch->is_def_format)
            dispatch->format_func = this->inner->format_func;

        // inherit log level
        if(!this->inner->is_def_level && dispatch->is_def_level)
            dispatch->log_level = this->inner->log_level;

        // inherit sink
        if(dispatch->output_sink == nullptr)
            dispatch->output_sink = this->inner->output_sink;

        this->inner->chain.push_back(std::move(dispatch));

        return *this;
    }